

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test3::prepareProgram
          (GPUShaderFP64Test3 *this,programInfo *program_info,uniformDataLayout uniform_data_layout)

{
  Context *ctx;
  GPUShaderFP64Test3 *pGVar1;
  _Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  local_890;
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  stringstream vertex_shader_code;
  undefined1 local_7c8 [376];
  stringstream tess_eval_shader_code;
  ostream local_640;
  stringstream tess_control_shader_code;
  ostream local_4b8;
  stringstream geometry_shader_code;
  ostream local_330;
  stringstream fragment_shader_code;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&fragment_shader_code);
  std::__cxx11::stringstream::stringstream((stringstream *)&geometry_shader_code);
  std::__cxx11::stringstream::stringstream((stringstream *)&tess_control_shader_code);
  std::__cxx11::stringstream::stringstream((stringstream *)&tess_eval_shader_code);
  std::__cxx11::stringstream::stringstream((stringstream *)&vertex_shader_code);
  pGVar1 = (GPUShaderFP64Test3 *)&stack0xfffffffffffffe58;
  std::operator<<((ostream *)&stack0xfffffffffffffe58,
                  "#version 400 core\n\nprecision highp float;\n\n");
  writePreamble(pGVar1,&local_330,GEOMETRY_SHADER);
  writePreamble(pGVar1,&local_4b8,TESS_CONTROL_SHADER);
  writePreamble(pGVar1,&local_640,TESS_EVAL_SHADER);
  pGVar1 = (GPUShaderFP64Test3 *)local_7c8;
  std::operator<<((ostream *)pGVar1,"#version 400 core\n\nprecision highp float;\n\n");
  writeUniformBlock(pGVar1,(ostream *)&stack0xfffffffffffffe58,uniform_data_layout);
  writeUniformBlock(pGVar1,&local_330,uniform_data_layout);
  writeUniformBlock(pGVar1,&local_4b8,uniform_data_layout);
  writeUniformBlock(pGVar1,&local_640,uniform_data_layout);
  writeUniformBlock(pGVar1,(ostream *)local_7c8,uniform_data_layout);
  writeVaryingDeclarations(pGVar1,(ostream *)&stack0xfffffffffffffe58,FRAGMENT_SHADER);
  writeVaryingDeclarations(pGVar1,&local_330,GEOMETRY_SHADER);
  writeVaryingDeclarations(pGVar1,&local_4b8,TESS_CONTROL_SHADER);
  writeVaryingDeclarations(pGVar1,&local_640,TESS_EVAL_SHADER);
  writeVaryingDeclarations(pGVar1,(ostream *)local_7c8,VERTEX_SHADER);
  writeMainBody(this,(ostream *)&stack0xfffffffffffffe58,FRAGMENT_SHADER);
  writeMainBody(this,&local_330,GEOMETRY_SHADER);
  writeMainBody(this,&local_4b8,TESS_CONTROL_SHADER);
  writeMainBody(this,&local_640,TESS_EVAL_SHADER);
  writeMainBody(this,(ostream *)local_7c8,VERTEX_SHADER);
  ctx = (this->super_TestCase).m_context;
  std::
  vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  ::vector((vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
            *)&local_890,&this->m_uniform_details);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  programInfo::init(program_info,(EVP_PKEY_CTX *)ctx);
  std::__cxx11::string::~string(local_878);
  std::__cxx11::string::~string(local_858);
  std::__cxx11::string::~string(local_838);
  std::__cxx11::string::~string(local_818);
  std::__cxx11::string::~string(local_7f8);
  std::
  _Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  ::~_Vector_base(&local_890);
  std::__cxx11::stringstream::~stringstream((stringstream *)&vertex_shader_code);
  std::__cxx11::stringstream::~stringstream((stringstream *)&tess_eval_shader_code);
  std::__cxx11::stringstream::~stringstream((stringstream *)&tess_control_shader_code);
  std::__cxx11::stringstream::~stringstream((stringstream *)&geometry_shader_code);
  std::__cxx11::stringstream::~stringstream((stringstream *)&fragment_shader_code);
  return;
}

Assistant:

void GPUShaderFP64Test3::prepareProgram(programInfo& program_info, uniformDataLayout uniform_data_layout) const
{
	/* Storage for shader source code */
	std::stringstream fragment_shader_code;
	std::stringstream geometry_shader_code;
	std::stringstream tess_control_shader_code;
	std::stringstream tess_eval_shader_code;
	std::stringstream vertex_shader_code;

	/* Write preambles */
	writePreamble(fragment_shader_code, FRAGMENT_SHADER);
	writePreamble(geometry_shader_code, GEOMETRY_SHADER);
	writePreamble(tess_control_shader_code, TESS_CONTROL_SHADER);
	writePreamble(tess_eval_shader_code, TESS_EVAL_SHADER);
	writePreamble(vertex_shader_code, VERTEX_SHADER);

	/* Write definition of named uniform block */
	writeUniformBlock(fragment_shader_code, uniform_data_layout);
	writeUniformBlock(geometry_shader_code, uniform_data_layout);
	writeUniformBlock(tess_control_shader_code, uniform_data_layout);
	writeUniformBlock(tess_eval_shader_code, uniform_data_layout);
	writeUniformBlock(vertex_shader_code, uniform_data_layout);

	/* Write definitions of varyings */
	writeVaryingDeclarations(fragment_shader_code, FRAGMENT_SHADER);
	writeVaryingDeclarations(geometry_shader_code, GEOMETRY_SHADER);
	writeVaryingDeclarations(tess_control_shader_code, TESS_CONTROL_SHADER);
	writeVaryingDeclarations(tess_eval_shader_code, TESS_EVAL_SHADER);
	writeVaryingDeclarations(vertex_shader_code, VERTEX_SHADER);

	/* Write main routine */
	writeMainBody(fragment_shader_code, FRAGMENT_SHADER);
	writeMainBody(geometry_shader_code, GEOMETRY_SHADER);
	writeMainBody(tess_control_shader_code, TESS_CONTROL_SHADER);
	writeMainBody(tess_eval_shader_code, TESS_EVAL_SHADER);
	writeMainBody(vertex_shader_code, VERTEX_SHADER);

	/* Init programInfo instance */
	program_info.init(m_context, m_uniform_details, fragment_shader_code.str().c_str(),
					  geometry_shader_code.str().c_str(), tess_control_shader_code.str().c_str(),
					  tess_eval_shader_code.str().c_str(), vertex_shader_code.str().c_str());
}